

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

bool anon_unknown.dwarf_28494c::CAPIExternalCommand::isResultValid::FallbackContext::handle
               (void *c_ctx,llb_buildsystem_command_t *c_command,llb_build_value *c_value)

{
  BuildSystem *system;
  bool bVar1;
  
  system = *c_ctx;
  operator_delete(c_ctx,8);
  bVar1 = llbuild::buildsystem::ExternalCommand::isResultValid
                    ((ExternalCommand *)c_command,system,(BuildValue *)c_value);
  return bVar1;
}

Assistant:

static bool handle(void* c_ctx,
                           llb_buildsystem_command_t* c_command,
                           llb_build_value* c_value) {
          auto* command = (CAPIExternalCommand*)c_command;
          auto* value = (CAPIBuildValue*)c_value;
          
          auto* ctx = static_cast<FallbackContext*>(c_ctx);
          BuildSystem& system = *ctx->buildSystem;
          delete ctx;
          
          return command->ExternalCommand::isResultValid(system, value->getInternalBuildValue());
        }